

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O1

SmallVector<unsigned_int,_2UL> * __thiscall
spvtools::utils::SmallVector<unsigned_int,_2UL>::operator=
          (SmallVector<unsigned_int,_2UL> *this,SmallVector<unsigned_int,_2UL> *that)

{
  unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__ptr_00;
  ulong uVar1;
  uint *puVar2;
  uint *puVar3;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> __ptr_01;
  ulong uVar4;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> this_01;
  ulong uVar5;
  pointer *__ptr;
  pointer __p;
  bool bVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  
  if (this->small_data_ == (uint *)0x0) {
    __assert_fail("small_data_",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/small_vector.h"
                  ,0x69,
                  "SmallVector<T, small_size> &spvtools::utils::SmallVector<unsigned int, 2>::operator=(const SmallVector<T, small_size> &) [T = unsigned int, small_size = 2]"
                 );
  }
  __x = (that->large_data_)._M_t.
        super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl;
  this_00 = &this->large_data_;
  __ptr_00 = (this->large_data_)._M_t.
             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             .
             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
             ._M_head_impl;
  if (__x == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    (this_00->_M_t).
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    if (__ptr_00 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 this_00,__ptr_00);
    }
    uVar1 = this->size_;
    uVar5 = that->size_;
    bVar6 = uVar5 != 0;
    if (uVar1 == 0 || !bVar6) {
      uVar4 = 0;
    }
    else {
      puVar2 = that->small_data_;
      puVar3 = this->small_data_;
      uVar4 = 0;
      do {
        puVar3[uVar4] = puVar2[uVar4];
        uVar4 = uVar4 + 1;
        uVar5 = that->size_;
        bVar6 = uVar4 < uVar5;
        if (uVar1 <= uVar4) break;
      } while (uVar4 < uVar5);
    }
    if ((bool)(uVar4 < uVar5 & bVar6)) {
      puVar2 = this->small_data_;
      puVar3 = that->small_data_;
      do {
        puVar2[uVar4] = puVar3[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    this->size_ = uVar5;
  }
  else if (__ptr_00 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    this_01._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18)
    ;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_01._M_head_impl,__x);
    local_28 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    __ptr_01._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
         _M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = this_01._M_head_impl;
    if (__ptr_01._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 this_00,__ptr_01._M_head_impl);
    }
    if (local_28 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_28,local_28);
    }
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(__ptr_00,__x);
  }
  return this;
}

Assistant:

SmallVector& operator=(const SmallVector& that) {
    assert(small_data_);
    if (that.large_data_) {
      if (large_data_) {
        *large_data_ = *that.large_data_;
      } else {
        large_data_ = MakeUnique<std::vector<T>>(*that.large_data_);
      }
    } else {
      large_data_.reset(nullptr);
      size_t i = 0;
      // Do a copy for any element in |this| that is already constructed.
      for (; i < size_ && i < that.size_; ++i) {
        small_data_[i] = that.small_data_[i];
      }

      if (i >= that.size_) {
        // If the size of |this| becomes smaller after the assignment, then
        // destroy any extra elements.
        for (; i < size_; ++i) {
          small_data_[i].~T();
        }
      } else {
        // If the size of |this| becomes larger after the assignement, copy
        // construct the new elements that are needed.
        for (; i < that.size_; ++i) {
          new (small_data_ + i) T(that.small_data_[i]);
        }
      }
      size_ = that.size_;
    }
    return *this;
  }